

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::sgd::ndf(sgd *this,vec3 *wh)

{
  long lVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  long in_RDX;
  float *extraout_RDX;
  double dVar5;
  value_type vVar6;
  int local_28;
  int i;
  vec3 *wh_local;
  sgd *this_local;
  value_type *ndf;
  
  (**(code **)(*(long *)wh + 0x10))();
  for (local_28 = 0; sVar2 = std::valarray<float>::size((valarray<float> *)this),
      local_28 < (int)sVar2; local_28 = local_28 + 1) {
    lVar1 = *(long *)&wh[1].y;
    lVar4 = (long)local_28;
    dVar5 = sgd__ndf((double)*(float *)(in_RDX + 8),*(double *)(lVar1 + 0x40 + lVar4 * 8),
                     *(double *)(lVar1 + 0x58 + lVar4 * 8),*(double *)(lVar1 + 0xa0 + lVar4 * 8));
    pfVar3 = std::valarray<float>::operator[]((valarray<float> *)this,(long)local_28);
    *pfVar3 = (float)dVar5;
  }
  vVar6._M_data = extraout_RDX;
  vVar6._M_size = (size_t)this;
  return vVar6;
}

Assistant:

brdf::value_type sgd::ndf(const vec3 &wh) const
{
	brdf::value_type ndf = zero_value();

	for (int i = 0; i < (int)ndf.size(); ++i)
		ndf[i] = (float_t)sgd__ndf((double)wh.z, m_data->alpha[i],
								   m_data->p[i], m_data->kap[i]);

	return ndf;
}